

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe55At1(uint8_t *buf)

{
  ulong local_18;
  uint64_t res;
  uint8_t *buf_local;
  
  local_18 = (long)((int)(uint)*buf >> 1) | (ulong)*(uint6 *)(buf + 1) << 7;
  if (((ulong)*(uint6 *)(buf + 1) << 7) >> 0x36 != 0) {
    local_18 = local_18 | 0xff80000000000000;
  }
  return local_18;
}

Assistant:

std::int64_t readFlSIntLe55At1(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 7;
    res |= (buf[0] >> 1);
    res &= UINT64_C(0x7fffffffffffff);

    if (res >> 54) {
        res |= UINT64_C(0xff80000000000000);
    }

    return static_cast<std::int64_t>(res);
}